

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datanode_info.cc
# Opt level: O2

int __thiscall DatanodeInfo::Write(DatanodeInfo *this,ByteBuffer *buffer)

{
  crail::ByteBuffer::PutInt(buffer,this->storage_type_);
  crail::ByteBuffer::PutInt(buffer,this->storage_class_);
  crail::ByteBuffer::PutInt(buffer,this->location_class_);
  crail::ByteBuffer::PutBytes(buffer,(char *)&this->ip_address_,4);
  crail::ByteBuffer::PutInt(buffer,this->port_);
  return 0;
}

Assistant:

int DatanodeInfo::Write(ByteBuffer &buffer) {
  buffer.PutInt(storage_type_);
  buffer.PutInt(storage_class_);
  buffer.PutInt(location_class_);
  buffer.PutBytes((char *)&ip_address_, 4);
  buffer.PutInt(port_);

  return 0;
}